

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSegment.cpp
# Opt level: O1

byte * __thiscall ServerSegment::prepareSegment(ServerSegment *this)

{
  ushort uVar1;
  byte4 *__s;
  
  __s = (byte4 *)calloc(0x5c0,1);
  memset(__s,0,0x5c0);
  *__s = this->sequenceNumber;
  __s[1] = this->ackNumber;
  *(byte *)(__s + 2) = this->ackFlag;
  *(byte *)((long)__s + 9) = this->finFlag;
  uVar1 = this->length;
  *(ushort *)((long)__s + 10) = uVar1;
  *(byte2 *)(__s + 3) = this->checksum;
  *(byte2 *)((long)__s + 0xe) = this->reserved;
  memcpy(__s + 4,this->data,(ulong)uVar1);
  return (byte *)__s;
}

Assistant:

byte *ServerSegment::prepareSegment() {

    int counter = 0;
    byte *buffer = (byte *) calloc(MTU, sizeof(byte));

    memset(buffer, 0, MTU);

    memcpy(buffer + counter, &sequenceNumber, sizeof(sequenceNumber));
    counter += sizeof(sequenceNumber);

    memcpy(buffer + counter, &ackNumber, sizeof(ackNumber));
    counter += sizeof(ackNumber);

    memcpy(buffer + counter, &ackFlag, 1);
    counter += sizeof(ackFlag);

    memcpy(buffer + counter, &finFlag, 1);
    counter += sizeof(finFlag);

    memcpy(buffer + counter, &length, sizeof(length));
    counter += sizeof(length);

    memcpy(buffer + counter, &checksum, sizeof(checksum));
    counter += sizeof(checksum);

    memcpy(buffer + counter, &reserved, sizeof(reserved));
    counter += sizeof(reserved);

    memcpy(buffer + counter, data, length);

    return buffer;
}